

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * String::fromHex(String *__return_storage_ptr__,byte *data,usize size)

{
  char *pcVar1;
  byte *pbVar2;
  byte *src;
  
  __return_storage_ptr__->data = &emptyData.super_Data;
  resize(__return_storage_ptr__,size * 2);
  pcVar1 = operator_cast_to_char_(__return_storage_ptr__);
  pbVar2 = data + size;
  for (; data < pbVar2; data = data + 1) {
    *pcVar1 = "0123456789ABCDEF"[*data >> 4];
    pcVar1[1] = "0123456789ABCDEF"[*data & 0xf];
    pcVar1 = pcVar1 + 2;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromHex(const byte* data, usize size)
{
  String result;
  result.resize(size * 2);
  char* dest = result;
  const char* hex = "0123456789ABCDEF";
  for(const byte* src =  data, * end = data + size; src < end; ++src)
  {
    dest[0] = hex[*src >> 4];
    dest[1] = hex[*src & 0xf];
    dest += 2;
  }
  return result;
}